

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O0

void __thiscall Potassco::SmodelsOutput::assume(SmodelsOutput *this,LitSpan *lits)

{
  Lit_t LVar1;
  Atom_t AVar2;
  int *piVar3;
  ostream *poVar4;
  Span<int> *in_RSI;
  long in_RDI;
  Lit_t *x_1;
  Lit_t *x;
  undefined8 in_stack_ffffffffffffffb8;
  void *pvVar5;
  SmodelsOutput *in_stack_ffffffffffffffc0;
  Lit_t *pLVar6;
  Lit_t *local_20;
  Lit_t *local_18;
  
  if (*(int *)(in_RDI + 0x14) < 2) {
    while (*(int *)(in_RDI + 0x14) != 2) {
      startRule(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      endRule(in_stack_ffffffffffffffc0);
      *(int *)(in_RDI + 0x14) = *(int *)(in_RDI + 0x14) + 1;
    }
    std::operator<<(*(ostream **)(in_RDI + 8),"B+\n");
    for (local_18 = begin<int>(in_RSI); piVar3 = end<int>((Span<int> *)0x267c70), local_18 != piVar3
        ; local_18 = local_18 + 1) {
      LVar1 = Potassco::lit(*local_18);
      if (0 < LVar1) {
        pvVar5 = *(void **)(in_RDI + 8);
        AVar2 = Potassco::atom(*local_18);
        poVar4 = (ostream *)std::ostream::operator<<(pvVar5,AVar2);
        std::operator<<(poVar4,"\n");
      }
    }
    std::operator<<(*(ostream **)(in_RDI + 8),"0\nB-\n");
    local_20 = begin<int>(in_RSI);
    while (pLVar6 = local_20, piVar3 = end<int>((Span<int> *)0x267d0d), pLVar6 != piVar3) {
      LVar1 = Potassco::lit(*local_20);
      if (LVar1 < 0) {
        pvVar5 = *(void **)(in_RDI + 8);
        AVar2 = Potassco::atom(*local_20);
        poVar4 = (ostream *)std::ostream::operator<<(pvVar5,AVar2);
        std::operator<<(poVar4,"\n");
      }
      local_20 = local_20 + 1;
    }
    if (((*(byte *)(in_RDI + 0x1a) & 1) != 0) && (*(int *)(in_RDI + 0x10) != 0)) {
      poVar4 = (ostream *)std::ostream::operator<<(*(void **)(in_RDI + 8),*(uint *)(in_RDI + 0x10));
      std::operator<<(poVar4,"\n");
    }
    std::operator<<(*(ostream **)(in_RDI + 8),"0\n");
    return;
  }
  fail(-2,"virtual void Potassco::SmodelsOutput::assume(const LitSpan &)",0x164,"sec_ < 2",
       "at most one compute statement supported in smodels format",0);
}

Assistant:

void SmodelsOutput::assume(const LitSpan& lits) {
	POTASSCO_REQUIRE(sec_ < 2, "at most one compute statement supported in smodels format");
	while (sec_ != 2) { startRule(End).endRule(); ++sec_; }
	os_ << "B+\n";
	for (const Lit_t* x = begin(lits); x != end(lits); ++x) {
		if (lit(*x) > 0) { os_ << atom(*x) << "\n"; }
	}
	os_ << "0\nB-\n";
	for (const Lit_t* x = begin(lits); x != end(lits); ++x) {
		if (lit(*x) < 0) { os_ << atom(*x) << "\n"; }
	}
	if (fHead_ && false_) {
		os_ << false_ << "\n";
	}
	os_ << "0\n";
}